

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

wchar_t variance(wchar_t *nums,wchar_t size,_Bool unbiased,_Bool of_mean,my_rational *frac)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  size_t sVar6;
  ushort *puVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  uint16_t sz [2];
  uint16_t nm [2];
  uint16_t q [8];
  my_rational f;
  uint16_t sn [4];
  uint16_t sp [4];
  uint16_t r0 [8];
  my_rational part;
  uint16_t w [3];
  uint16_t r1 [6];
  uint16_t uStack_7c;
  uint16_t uStack_7a;
  uint16_t ss [6];
  uint16_t sqs [8];
  uint16_t r2 [6];
  
  if (size < L'\x02') {
    if (frac == (my_rational *)0x0) {
      return L'\0';
    }
    frac->n = 0;
    frac->d = 1;
    return L'\0';
  }
  uVar8 = size - (uint)unbiased;
  uVar11 = 0;
  ss[0] = 0;
  ss[1] = 0;
  ss[2] = 0;
  ss[3] = 0;
  ss[4] = 0;
  ss[5] = 0;
  sp[0] = 0;
  sp[1] = 0;
  sp[2] = 0;
  sp[3] = 0;
  sn[0] = 0;
  sn[1] = 0;
  sn[2] = 0;
  sn[3] = 0;
  do {
    wVar4 = nums[uVar11];
    if (wVar4 != L'\0') {
      if (wVar4 < L'\x01') {
        lVar9 = 1;
        uVar12 = (wVar4 ^ 0x7fffffffU) + 0x80000001;
        do {
          uVar3 = uVar12;
          q[lVar9] = (uint16_t)uVar3;
          bVar13 = lVar9 != 0;
          lVar9 = lVar9 + -1;
          uVar12 = uVar3 >> 0x10;
        } while (bVar13);
        if (0xffff < uVar3) {
          __assert_fail("!over",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x625,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
        uVar2 = addip_u16n(sn,q,4,2);
        if (uVar2 != 0) {
          __assert_fail("carry == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x626,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
      }
      else {
        lVar9 = 1;
        do {
          wVar5 = wVar4;
          q[lVar9] = (uint16_t)wVar5;
          bVar13 = lVar9 != 0;
          lVar9 = lVar9 + -1;
          wVar4 = (uint)wVar5 >> 0x10;
        } while (bVar13);
        if (0xffff < (uint)wVar5) {
          __assert_fail("!over",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x622,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
        uVar2 = addip_u16n(sp,q,4,2);
        if (uVar2 != 0) {
          __assert_fail("carry == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x623,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
      }
      _Var1 = mul_u16n(sqs,q,q,4,2,2);
      if (_Var1) {
        __assert_fail("!over",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x628,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      uVar2 = addip_u16n(ss,sqs,6,4);
      if (uVar2 != 0) {
        __assert_fail("carry == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x629,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != (uint)size);
  wVar4 = cmp_u16n(sp,sn,4,4);
  if (wVar4 < L'\0') {
    subip_u16n(sn,sp,4,4);
    _Var1 = mul_u16n(sqs,sn,sn,8,4,4);
    if (_Var1) {
      __assert_fail("!over",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x631,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
  }
  else {
    subip_u16n(sp,sn,4,4);
    _Var1 = mul_u16n(sqs,sp,sp,8,4,4);
    if (_Var1) {
      __assert_fail("!over",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x62e,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
  }
  lVar9 = 1;
  uVar11 = (ulong)(uint)size;
  do {
    uVar10 = uVar11;
    sz[lVar9] = (uint16_t)uVar10;
    bVar13 = lVar9 != 0;
    lVar9 = lVar9 + -1;
    uVar11 = uVar10 >> 0x10;
  } while (bVar13);
  if (0xffff < (uint)uVar10) {
    __assert_fail("!over",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x633,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
  }
  wVar4 = div_u16n(q,r0,w,sqs,sz,8,8,2);
  if (wVar4 != L'\0') {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x636,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
  }
  sVar6 = msb_u16n(r0,8);
  if (sVar6 != 0) {
    uVar2 = 1;
    lVar9 = 1;
    do {
      r1[lVar9] = uVar2;
      uVar2 = 0;
      bVar13 = lVar9 != 0;
      lVar9 = lVar9 + -1;
    } while (bVar13);
    addip_u16n(q,r1,8,2);
    r1[0] = r0[0];
    r1[1] = r0[1];
    r1[2] = r0[2];
    r1[3] = r0[3];
    r1[4] = r0[4];
    r1[5] = r0[5];
    uStack_7c = r0[6];
    uStack_7a = r0[7];
    lVar9 = 7;
    uVar11 = (ulong)(uint)size;
    do {
      uVar10 = uVar11;
      r0[lVar9] = (uint16_t)uVar10;
      bVar13 = lVar9 != 0;
      lVar9 = lVar9 + -1;
      uVar11 = uVar10 >> 0x10;
    } while (bVar13);
    if (0xffff < (uint)uVar10) {
      __assert_fail("!over",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x645,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    wVar4 = cmp_u16n(r0,r1,8,8);
    if (wVar4 < L'\x01') {
      __assert_fail("cmp_u16n(r0, tmp, N_ELEMENTS(r0), N_ELEMENTS(tmp)) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x646,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    subip_u16n(r0,r1,8,8);
  }
  wVar4 = cmp_u16n(ss,q,6,8);
  if (wVar4 < L'\0') {
    __assert_fail("cmp_u16n(ss, q, N_ELEMENTS(ss), N_ELEMENTS(q)) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x649,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
  }
  subip_u16n(ss,q,6,8);
  lVar9 = 1;
  uVar11 = (ulong)uVar8;
  do {
    uVar10 = uVar11;
    nm[lVar9] = (uint16_t)uVar10;
    bVar13 = lVar9 != 0;
    lVar9 = lVar9 + -1;
    uVar11 = uVar10 >> 0x10;
  } while (bVar13);
  if (0xffff < (uint)uVar10) {
    __assert_fail("!over",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x64b,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
  }
  wVar4 = div_u16n(q,r1,w,ss,nm,6,6,2);
  if (wVar4 != L'\0') {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x64e,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
  }
  if (of_mean) {
    f = (my_rational)q._0_8_;
    wVar4 = div_u16n(q,r2,w,(uint16_t *)&f,sz,6,6,2);
    if (wVar4 != L'\0') {
      __assert_fail("i == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x657,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
  }
  sVar6 = msb_u16n(q,6);
  if (sVar6 < 0x21) {
    lVar9 = 0;
    puVar7 = q + 5;
    wVar4 = L'\0';
    do {
      wVar4 = wVar4 + ((uint)*puVar7 << ((byte)lVar9 & 0x1f));
      lVar9 = lVar9 + 0x10;
      puVar7 = puVar7 + -1;
    } while (lVar9 != 0x20);
    if (L'\xffffffff' < wVar4) {
      wVar5 = cmp_u16n(sz,r0,2,8);
      if (wVar5 < L'\x01') {
        __assert_fail("cmp_u16n(sz, r0, N_ELEMENTS(sz), N_ELEMENTS(r0)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x66f,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      wVar5 = cmp_u16n(nm,r1,2,6);
      if (wVar5 < L'\x01') {
        __assert_fail("cmp_u16n(nm, r1, N_ELEMENTS(nm), N_ELEMENTS(r1)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x670,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      if ((of_mean) && (wVar5 = cmp_u16n(sz,r2,2,6), wVar5 < L'\x01')) {
        __assert_fail("!of_mean || cmp_u16n(sz, r2, N_ELEMENTS(sz), N_ELEMENTS(r2)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x671,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      lVar9 = 0;
      puVar7 = r0 + 7;
      uVar12 = 0;
      do {
        uVar12 = uVar12 + ((uint)*puVar7 << ((byte)lVar9 & 0x1f));
        lVar9 = lVar9 + 0x10;
        puVar7 = puVar7 + -1;
      } while (lVar9 != 0x20);
      f = my_rational_construct(uVar12,size);
      part = my_rational_construct(1,uVar8);
      f = my_rational_product(&f,&part);
      lVar9 = 0;
      puVar7 = r1 + 5;
      uVar12 = 0;
      do {
        uVar12 = uVar12 + ((uint)*puVar7 << ((byte)lVar9 & 0x1f));
        lVar9 = lVar9 + 0x10;
        puVar7 = puVar7 + -1;
      } while (lVar9 != 0x20);
      part = my_rational_construct(uVar12,uVar8);
      f = my_rational_sum(&f,&part);
      if (of_mean) {
        part = my_rational_construct(1,size);
        f = my_rational_product(&f,&part);
        lVar9 = 0;
        puVar7 = r2 + 5;
        uVar8 = 0;
        do {
          uVar8 = uVar8 + ((uint)*puVar7 << ((byte)lVar9 & 0x1f));
          lVar9 = lVar9 + 0x10;
          puVar7 = puVar7 + -1;
        } while (lVar9 != 0x20);
        part = my_rational_construct(uVar8,size);
        f = my_rational_sum(&f,&part);
      }
      if (frac == (my_rational *)0x0) {
        return wVar4 + (uint)(wVar4 != L'\x7fffffff' && f.d + 1 >> 1 <= f.n);
      }
      goto LAB_001fc0b6;
    }
  }
  wVar4 = L'\x7fffffff';
  if (frac == (my_rational *)0x0) {
    return L'\x7fffffff';
  }
  f.n = 0;
  f.d = 1;
LAB_001fc0b6:
  *frac = f;
  return wVar4;
}

Assistant:

int variance(const int *nums, int size, bool unbiased, bool of_mean,
		struct my_rational *frac)
{
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
	/* Holds the absolute value of INT_MIN in an unsigned int. */
	unsigned int abs_int_min = (unsigned int)(-(INT_MIN + 1)) + 1;
	/*
	 * The unbiased variance estimator, sum((nums[i] - sum(nums[i]) /
	 * size)^2) / (size - 1), is equivalent to (sum(nums[i]^2) -
	 * (sum(nums[i]))^2 / size) / (size - 1).  Store sum(nums[i]^2) in
	 * ss, the positive contributions to sum(nums[i]) in sp, and the
	 * negative contributions to sum(nums[i]) in sn.
	 */
	uint16_t ss[3 * MP_DIGITS], sp[2 * MP_DIGITS], sn[2 * MP_DIGITS];
	uint16_t sqs[4 * MP_DIGITS];
	uint16_t q[4 * MP_DIGITS], r0[4 * MP_DIGITS], r1[3 * MP_DIGITS];
	uint16_t r2[3 * MP_DIGITS];
	uint16_t sz[MP_DIGITS], nm[MP_DIGITS], w[MP_DIGITS + 1];
	struct my_rational f, part;
	unsigned int var;
	int norm, i;
	/*
	 * Avoid compiler warnings about set but unused variables when
	 * assertions are stripped.
	 */
#ifndef NDEBUG
	bool over;
#define CHECK_OVERFLOW(x) over = x; assert(!over)
	uint16_t carry;
#define CHECK_CARRY(x) carry = x; assert(carry == 0)
#else
#define CHECK_OVERFLOW(x) x
#define CHECK_CARRY(x) x
#endif

	if (size <= 1) {
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return 0;
	}

	norm = size - ((unbiased) ? 1 : 0);
	zer_u16n(ss, N_ELEMENTS(ss));
	zer_u16n(sp, N_ELEMENTS(sp));
	zer_u16n(sn, N_ELEMENTS(sn));

	for (i = 0; i < size; ++i) {
		uint16_t a[MP_DIGITS], a2[2 * MP_DIGITS];

		if (nums[i] == 0) {
			continue;
		}
		if (nums[i] > 0) {
			CHECK_OVERFLOW(ini_u16n(a, N_ELEMENTS(a), nums[i]));
			CHECK_CARRY(addip_u16n(sp, a, N_ELEMENTS(sp), N_ELEMENTS(a)));
		} else if (nums[i] < 0) {
			CHECK_OVERFLOW(ini_u16n(a, N_ELEMENTS(a), abs_int_min - (unsigned int)(nums[i] - INT_MIN)));
			CHECK_CARRY(addip_u16n(sn, a, N_ELEMENTS(sn), N_ELEMENTS(a)));
		}
		CHECK_OVERFLOW(mul_u16n(a2, a, a, N_ELEMENTS(a2), N_ELEMENTS(a), N_ELEMENTS(a)));
		CHECK_CARRY(addip_u16n(ss, a2, N_ELEMENTS(ss), N_ELEMENTS(a2)));
	}

	if (cmp_u16n(sp, sn, N_ELEMENTS(sp), N_ELEMENTS(sn)) >= 0) {
		subip_u16n(sp, sn, N_ELEMENTS(sp), N_ELEMENTS(sn));
		CHECK_OVERFLOW(mul_u16n(sqs, sp, sp, N_ELEMENTS(sqs), N_ELEMENTS(sp), N_ELEMENTS(sp)));
	} else {
		subip_u16n(sn, sp, N_ELEMENTS(sn), N_ELEMENTS(sp));
		CHECK_OVERFLOW(mul_u16n(sqs, sn, sn, N_ELEMENTS(sqs), N_ELEMENTS(sn), N_ELEMENTS(sn)));
	}
	CHECK_OVERFLOW(ini_u16n(sz, N_ELEMENTS(sz), size));
	i = div_u16n(q, r0, w, sqs, sz, N_ELEMENTS(q), N_ELEMENTS(sqs),
		N_ELEMENTS(sz));
	assert(i == 0);
	if (msb_u16n(r0, N_ELEMENTS(r0)) > 0) {
		/*
		 * Since this remainder is subtracted, add one to the
		 * quotient and convert the remainder to size - r0.  That way
		 * later calculations can treat it as a non-negative term, like
		 * the other fractional parts.
		 */
		uint16_t tmp[4 * MP_DIGITS];

		CHECK_OVERFLOW(ini_u16n(tmp, MP_DIGITS, 1));
		addip_u16n(q, tmp, N_ELEMENTS(q), MP_DIGITS);
		for (i = 0; i < (int)(N_ELEMENTS(r0)); ++i) {
			tmp[i] = r0[i];
		}
		CHECK_OVERFLOW(ini_u16n(r0, N_ELEMENTS(r0), size));
		assert(cmp_u16n(r0, tmp, N_ELEMENTS(r0), N_ELEMENTS(tmp)) > 0);
		subip_u16n(r0, tmp, N_ELEMENTS(r0), N_ELEMENTS(tmp));
	}
	assert(cmp_u16n(ss, q, N_ELEMENTS(ss), N_ELEMENTS(q)) >= 0);
	subip_u16n(ss, q, N_ELEMENTS(ss), N_ELEMENTS(q));
	CHECK_OVERFLOW(ini_u16n(nm, N_ELEMENTS(nm), norm));
	i = div_u16n(q, r1, w, ss, nm, 3 * MP_DIGITS, N_ELEMENTS(ss),
		N_ELEMENTS(nm));
	assert(i == 0);
	if (of_mean) {
		uint16_t qcpy[3 * MP_DIGITS];

		for (i = 0; i < (int)(N_ELEMENTS(qcpy)); ++i) {
			qcpy[i] = q[i];
		}
		i = div_u16n(q, r2, w, qcpy, sz, 3 * MP_DIGITS,
			N_ELEMENTS(qcpy), N_ELEMENTS(sz));
		assert(i == 0);
	}
	if (msb_u16n(q, 3 * MP_DIGITS) > CHAR_BIT * sizeof(unsigned int)) {
		/* Variance is greater than UINT_MAX. */
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return INT_MAX;
	}
	var = ext_u16n(q, 3 * MP_DIGITS);
	if (var > INT_MAX) {
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return INT_MAX;
	}
	/*
	 * Account for the fractional part.  If of_mean is false, that is
	 * r1 / norm + r0 / (size * norm).  If of_mean is true,
	 * that is r2 / size + r1 / (size * norm) + r0 /
	 * (size * size * norm).  Since 0 <= r0 < size,
	 * 0 <= r1 < norm, and 0 <= r2 < size, the total of the fractional
	 * terms is greater than or equal to zero and less than one.
	 */
	assert(cmp_u16n(sz, r0, N_ELEMENTS(sz), N_ELEMENTS(r0)) > 0);
	assert(cmp_u16n(nm, r1, N_ELEMENTS(nm), N_ELEMENTS(r1)) > 0);
	assert(!of_mean || cmp_u16n(sz, r2, N_ELEMENTS(sz), N_ELEMENTS(r2)) > 0);
	f = my_rational_construct(ext_u16n(r0, N_ELEMENTS(r0)), size);
	part = my_rational_construct(1, norm);
	f = my_rational_product(&f, &part);
	part = my_rational_construct(ext_u16n(r1, N_ELEMENTS(r1)), norm);
	f = my_rational_sum(&f, &part);
	if (of_mean) {
		part = my_rational_construct(1, size);
		f = my_rational_product(&f, &part);
		part = my_rational_construct(ext_u16n(r2, N_ELEMENTS(r2)), size);
		f = my_rational_sum(&f, &part);
	}
	if (frac) {
		*frac = f;
	} else {
		/* Round to nearest. */
		if (f.n >= (f.d + 1) / 2 && var < INT_MAX) {
			++var;
		}
	}

	return var;
#undef MP_DIGITS
#undef CHECK_CARRY
#undef CHECK_OVERFLOW
}